

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmUtility.cpp
# Opt level: O3

GMM_RESOURCE_FORMAT
GmmLib::Utility::GmmGetFormatForASTC
          (uint8_t HDR,uint8_t Float,uint32_t BlockWidth,uint32_t BlockHeight,uint32_t BlockDepth)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  GMM_RESOURCE_FORMAT GVar7;
  GMM_RESOURCE_FORMAT GVar8;
  uint uVar9;
  undefined7 in_register_00000031;
  undefined7 in_register_00000039;
  GMM_RESOURCE_FORMAT GVar10;
  uint uVar11;
  uint uVar12;
  
  GVar10 = (uint)((int)CONCAT71(in_register_00000031,Float) != 0) << 6 |
           (uint)((int)CONCAT71(in_register_00000039,HDR) != 0) << 8;
  bVar5 = BlockWidth != 4;
  bVar6 = (BlockHeight ^ 4) != 0;
  GVar8 = GMM_FORMAT_INVALID;
  if ((bVar5 || bVar6) || 1 < BlockDepth) {
    uVar11 = BlockWidth ^ 5;
    GVar7 = GMM_FORMAT_A8X8_UNORM_G8R8_SNORM;
    if (((BlockHeight ^ 4) != 0 || uVar11 != 0) || 1 < BlockDepth) {
      bVar1 = uVar11 != 0;
      bVar2 = (BlockHeight ^ 5) != 0;
      GVar8 = GMM_FORMAT_A1B5G5R5_UNORM;
      if ((bVar1 || bVar2) || 1 < BlockDepth) {
        uVar9 = BlockWidth ^ 6;
        GVar7 = GMM_FORMAT_B4G4R4A4_UNORM_SRGB;
        if (((BlockHeight ^ 5) != 0 || uVar9 != 0) || 1 < BlockDepth) {
          bVar3 = uVar9 != 0;
          bVar4 = BlockHeight != 6;
          GVar8 = GMM_FORMAT_A4B4G4R4_UNORM;
          if ((!bVar3 && !bVar4) && BlockDepth < 2) goto LAB_001b4de0;
          uVar12 = BlockHeight - 5 | BlockDepth;
          GVar7 = GMM_FORMAT_B10G10R10A2_UNORM;
          if (BlockWidth != 8 || 1 < uVar12) {
            if ((BlockHeight == 8 && BlockWidth == 8) && BlockDepth < 2) {
              GVar8 = GMM_FORMAT_A4P4_UNORM_PALETTE1;
              GVar7 = GMM_FORMAT_B10G10R10A2_UNORM;
              goto LAB_001b4de0;
            }
            if ((((((BlockHeight != 8 || BlockWidth != 10) || 1 < BlockDepth) &&
                   (1 < uVar12 || BlockWidth != 10)) &&
                 ((BlockWidth != 10 || (BlockHeight ^ 10) != 0) || 1 < BlockDepth)) &&
                (((BlockHeight ^ 10) != 0 || (BlockWidth ^ 0xc) != 0) || 1 < BlockDepth)) &&
               (((BlockWidth ^ 0xc) != 0 || BlockHeight != 0xc) || 1 < BlockDepth)) {
              uVar12 = BlockWidth - 3;
              if ((BlockDepth != 3) || ((1 < uVar12 || BlockHeight != 3) && (bVar5 || bVar6))) {
                if ((BlockDepth != 4) || ((bVar6 || bVar5 && uVar11 != 0) && (bVar1 || bVar2))) {
                  if (((bVar3 || bVar4) || BlockDepth != 6) &&
                     (BlockDepth != 5 || (bVar3 || bVar4) && (bVar2 || bVar1 && uVar9 != 0))) {
                    return GMM_FORMAT_INVALID;
                  }
                  uVar11 = 0x10;
                  if (1 < uVar12) {
                    uVar11 = (uint)(BlockWidth != 5) << 4 | 0x20;
                  }
                  uVar9 = (uint)(BlockHeight != 5) * 4 + 8;
                  uVar12 = BlockDepth == 5 ^ 3;
                }
                else {
                  uVar11 = 0x10;
                  if (1 < uVar12) {
                    uVar11 = (uint)(BlockWidth != 5) << 4 | 0x20;
                  }
                  uVar9 = 4;
                  if (1 < BlockHeight - 3) {
                    uVar9 = (uint)(BlockHeight != 5) * 4 + 8;
                  }
                  uVar12 = 1;
                }
              }
              else {
                uVar11 = 0x30;
                if (uVar12 < 2) {
                  uVar11 = (uint)(BlockWidth != 3) << 4;
                }
                uVar9 = (uint)(BlockHeight != 3) << 2;
                uVar12 = 0;
              }
              return GVar10 + GMM_FORMAT_R8G8B8A8_USCALED + (uVar9 | uVar12 | uVar11);
            }
            GVar7 = (uint)(BlockWidth != 10) * 8 + GMM_FORMAT_BC7_UNORM;
          }
          if (BlockHeight != 5) {
            if (BlockHeight != 6) {
              if (BlockHeight == 8) {
                GVar8 = GMM_FORMAT_A4P4_UNORM_PALETTE1;
              }
              else {
                GVar8 = BlockHeight == 10 ^ GMM_FORMAT_A8P8_UNORM_PALETTE1;
              }
            }
            goto LAB_001b4de0;
          }
        }
        GVar8 = GMM_FORMAT_A1B5G5R5_UNORM;
      }
    }
  }
  else {
    GVar7 = GMM_FORMAT_INVALID;
  }
LAB_001b4de0:
  return GVar7 | GVar8 | GVar10;
}

Assistant:

GMM_RESOURCE_FORMAT GMM_STDCALL GmmGetFormatForASTC(uint8_t HDR, uint8_t Float, uint32_t BlockWidth, uint32_t BlockHeight, uint32_t BlockDepth)
        {
            // Full enums/etc. in case we ever need to typedef them...
            enum GMM_SURFACESTATE_FORMAT_ASTC_DYNAMIC_RANGE
            {
                GMM_SURFACESTATE_FORMAT_ASTC_DYNAMIC_RANGE_LDR = 0,
                GMM_SURFACESTATE_FORMAT_ASTC_DYNAMIC_RANGE_HDR = 1,
            };

            enum GMM_SURFACESTATE_FORMAT_ASTC_BLOCK_DIMENSION
            {
                GMM_SURFACESTATE_FORMAT_ASTC_BLOCK_DIMENSION_2D = 0,
                GMM_SURFACESTATE_FORMAT_ASTC_BLOCK_DIMENSION_3D = 1,
            };

            enum GMM_SURFACESTATE_FORMAT_ASTC_DECODE_FORMAT
            {
                GMM_SURFACESTATE_FORMAT_ASTC_DECODE_FORMAT_UNORM8_sRGB = 0,
                GMM_SURFACESTATE_FORMAT_ASTC_DECODE_FORMAT_FLOAT16     = 1,
            };

            enum GMM_SURFACESTATE_FORMAT_ASTC_2D_BLOCK_SIZE
            {
                GMM_SURFACESTATE_FORMAT_ASTC_2D_BLOCK_SIZE_4px   = 0,
                GMM_SURFACESTATE_FORMAT_ASTC_2D_BLOCK_SIZE_5px   = 1,
                GMM_SURFACESTATE_FORMAT_ASTC_2D_BLOCK_SIZE_6px   = 2,
                __GMM_SURFACESTATE_FORMAT_ASTC_2D_BLOCK_SIZE_0x3 = 3,
                GMM_SURFACESTATE_FORMAT_ASTC_2D_BLOCK_SIZE_8px   = 4,
                __GMM_SURFACESTATE_FORMAT_ASTC_2D_BLOCK_SIZE_0x5 = 5,
                GMM_SURFACESTATE_FORMAT_ASTC_2D_BLOCK_SIZE_10px  = 6,
                GMM_SURFACESTATE_FORMAT_ASTC_2D_BLOCK_SIZE_12px  = 7,
            };

            enum GMM_SURFACESTATE_FORMAT_ASTC_3D_BLOCK_SIZE
            {
                GMM_SURFACESTATE_FORMAT_ASTC_3D_BLOCK_SIZE_3px = 0,
                GMM_SURFACESTATE_FORMAT_ASTC_3D_BLOCK_SIZE_4px = 1,
                GMM_SURFACESTATE_FORMAT_ASTC_3D_BLOCK_SIZE_5px = 2,
                GMM_SURFACESTATE_FORMAT_ASTC_3D_BLOCK_SIZE_6px = 3,
            };

            union GMM_SURFACESTATE_FORMAT_ASTC {
                struct // Common Fields...
                {
                    uint32_t Reserved1 : 6;      // [2D/3D-Specific Fields]
                    uint32_t DecodeFormat : 1;   // GMM_SURFACESTATE_FORMAT_ASTC_DECODE_FORMAT
                    uint32_t BlockDimension : 1; // GMM_SURFACESTATE_FORMAT_ASTC_BLOCK_DIMENSION
                    uint32_t DynamicRange : 1;   // GMM_SURFACESTATE_FORMAT_ASTC_DYNAMIC_RANGE
                    uint32_t Reserved2 : 23;
                };
                struct // 2D-Specific Fields...
                {
                    uint32_t BlockHeight2D : 3; // GMM_SURFACESTATE_FORMAT_ASTC_2D_BLOCK_SIZE
                    uint32_t BlockWidth2D : 3;  // GMM_SURFACESTATE_FORMAT_ASTC_2D_BLOCK_SIZE
                    uint32_t Reserved3 : 3;     // [Common Fields]
                    uint32_t Reserved4 : 23;
                };
                struct // 3D-Specific Fields...
                {
                    uint32_t BlockDepth3D : 2;  // GMM_SURFACESTATE_FORMAT_ASTC_3D_BLOCK_SIZE
                    uint32_t BlockHeight3D : 2; // GMM_SURFACESTATE_FORMAT_ASTC_3D_BLOCK_SIZE
                    uint32_t BlockWidth3D : 2;  // GMM_SURFACESTATE_FORMAT_ASTC_3D_BLOCK_SIZE
                    uint32_t Reserved5 : 3;     // [Common Fields]
                    uint32_t Reserved6 : 23;
                };
                struct
                {
                    uint32_t Value : 9;
                    uint32_t Reserved7 : 23;
                };
            } Format = {0};
            C_ASSERT(sizeof(union GMM_SURFACESTATE_FORMAT_ASTC) == sizeof(uint32_t));

            // TODO(Minor): Verify and fail for invalid HDR/sRGB combinations.

            if(BlockDepth == 0)
                BlockDepth = 1;

            Format.DynamicRange = HDR ?
                                  GMM_SURFACESTATE_FORMAT_ASTC_DYNAMIC_RANGE_HDR :
                                  GMM_SURFACESTATE_FORMAT_ASTC_DYNAMIC_RANGE_LDR;

            Format.DecodeFormat = Float ?
                                  GMM_SURFACESTATE_FORMAT_ASTC_DECODE_FORMAT_FLOAT16 :
                                  GMM_SURFACESTATE_FORMAT_ASTC_DECODE_FORMAT_UNORM8_sRGB;

            // Validate Block Dimensions...
            if(!(
#define GMM_FORMAT_INCLUDE_ASTC_FORMATS_ONLY
#define GMM_FORMAT(Name, bpe, Width, Height, Depth, IsRT, IsASTC, RcsSurfaceFormat, SSCompressionFmt, Availability) \
    ((BlockWidth == (Width)) && (BlockHeight == (Height)) && (BlockDepth == (Depth))) ||
#include "External/Common/GmmFormatTable.h"
               0)) // <-- 0 benignly terminates the chain of OR expressions.
            {
                goto Invalid;
            }

            if(BlockDepth <= 1)
            {
                Format.BlockDimension = GMM_SURFACESTATE_FORMAT_ASTC_BLOCK_DIMENSION_2D;

                // clang-format off
                Format.BlockWidth2D =
                    (BlockWidth ==  4) ? GMM_SURFACESTATE_FORMAT_ASTC_2D_BLOCK_SIZE_4px :
                    (BlockWidth ==  5) ? GMM_SURFACESTATE_FORMAT_ASTC_2D_BLOCK_SIZE_5px :
                    (BlockWidth ==  6) ? GMM_SURFACESTATE_FORMAT_ASTC_2D_BLOCK_SIZE_6px :
                    (BlockWidth ==  8) ? GMM_SURFACESTATE_FORMAT_ASTC_2D_BLOCK_SIZE_8px :
                    (BlockWidth == 10) ? GMM_SURFACESTATE_FORMAT_ASTC_2D_BLOCK_SIZE_10px :
                    GMM_SURFACESTATE_FORMAT_ASTC_2D_BLOCK_SIZE_12px;
                Format.BlockHeight2D =
                    (BlockHeight ==  4) ? GMM_SURFACESTATE_FORMAT_ASTC_2D_BLOCK_SIZE_4px :
                    (BlockHeight ==  5) ? GMM_SURFACESTATE_FORMAT_ASTC_2D_BLOCK_SIZE_5px :
                    (BlockHeight ==  6) ? GMM_SURFACESTATE_FORMAT_ASTC_2D_BLOCK_SIZE_6px :
                    (BlockHeight ==  8) ? GMM_SURFACESTATE_FORMAT_ASTC_2D_BLOCK_SIZE_8px :
                    (BlockHeight == 10) ? GMM_SURFACESTATE_FORMAT_ASTC_2D_BLOCK_SIZE_10px :
                    GMM_SURFACESTATE_FORMAT_ASTC_2D_BLOCK_SIZE_12px;
                // clang-format on
            }
            else
            {
                Format.BlockDimension = GMM_SURFACESTATE_FORMAT_ASTC_BLOCK_DIMENSION_3D;
                // clang-format off
                Format.BlockWidth3D =
                    (BlockWidth == 3) ? GMM_SURFACESTATE_FORMAT_ASTC_3D_BLOCK_SIZE_3px :
                    (BlockWidth == 4) ? GMM_SURFACESTATE_FORMAT_ASTC_3D_BLOCK_SIZE_4px :
                    (BlockWidth == 5) ? GMM_SURFACESTATE_FORMAT_ASTC_3D_BLOCK_SIZE_5px :
                    GMM_SURFACESTATE_FORMAT_ASTC_3D_BLOCK_SIZE_6px;
                Format.BlockHeight3D =
                    (BlockHeight == 3) ? GMM_SURFACESTATE_FORMAT_ASTC_3D_BLOCK_SIZE_3px :
                    (BlockHeight == 4) ? GMM_SURFACESTATE_FORMAT_ASTC_3D_BLOCK_SIZE_4px :
                    (BlockHeight == 5) ? GMM_SURFACESTATE_FORMAT_ASTC_3D_BLOCK_SIZE_5px :
                    GMM_SURFACESTATE_FORMAT_ASTC_3D_BLOCK_SIZE_6px;
                Format.BlockDepth3D =
                    (BlockDepth == 3) ? GMM_SURFACESTATE_FORMAT_ASTC_3D_BLOCK_SIZE_3px :
                    (BlockDepth == 4) ? GMM_SURFACESTATE_FORMAT_ASTC_3D_BLOCK_SIZE_4px :
                    (BlockDepth == 5) ? GMM_SURFACESTATE_FORMAT_ASTC_3D_BLOCK_SIZE_5px :
                    GMM_SURFACESTATE_FORMAT_ASTC_3D_BLOCK_SIZE_6px;
                // clang-format on
            }

            return ((GMM_RESOURCE_FORMAT)Format.Value);
        Invalid:
            return (GMM_FORMAT_INVALID);
        }